

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

bool __thiscall
frozen::boyer_moore_searcher<1UL>::is_prefix
          (boyer_moore_searcher<1UL> *this,char (*needle) [2],size_t pos)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 + pos == 1) break;
    uVar1 = uVar2 + 1;
  } while ((*needle)[uVar2] == (*needle)[uVar2 + pos]);
  return 1 - pos <= uVar2;
}

Assistant:

constexpr bool is_prefix(char const (&needle)[size + 1], std::size_t pos) {
    std::size_t suffixlen = size - pos;
    
    for (std::size_t i = 0; i < suffixlen; i++) {
      if (needle[i] != needle[pos + i])
        return false;
    }
    return true;
  }